

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collada.cpp
# Opt level: O3

void CMU462::Collada::ColladaParser::parse_material(XMLElement *xml,MaterialInfo *material)

{
  double dVar1;
  int iVar2;
  char *pcVar3;
  XMLElement *pXVar4;
  XMLElement *pXVar5;
  char *pcVar6;
  XMLElement *pXVar7;
  XMLElement *pXVar8;
  XMLElement *this;
  BSDF *pBVar9;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dc_01;
  undefined4 extraout_XMM0_Dc_02;
  undefined4 extraout_XMM0_Dc_03;
  undefined4 extraout_XMM0_Dc_04;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  undefined4 extraout_XMM0_Dd_01;
  undefined4 extraout_XMM0_Dd_02;
  undefined4 extraout_XMM0_Dd_03;
  undefined4 extraout_XMM0_Dd_04;
  Spectrum SVar10;
  string type;
  allocator local_2dd;
  float local_2dc;
  undefined1 local_2d8 [16];
  double local_2c8;
  MaterialInfo *local_2c0;
  undefined1 local_2b8 [16];
  _func_int **local_2a8;
  _func_int **local_2a0;
  double local_298;
  double local_290;
  _func_int **local_288;
  undefined **local_280;
  _func_int **local_278;
  string local_270;
  string local_250;
  string local_230;
  string local_210;
  string local_1f0;
  string local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  undefined1 *local_150 [2];
  undefined1 local_140 [16];
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  pcVar3 = tinyxml2::XMLElement::Attribute(xml,"id",(char *)0x0);
  pcVar6 = (char *)(material->super_Instance).id._M_string_length;
  strlen(pcVar3);
  std::__cxx11::string::_M_replace((ulong)&(material->super_Instance).id,0,pcVar6,(ulong)pcVar3);
  pcVar3 = tinyxml2::XMLElement::Attribute(xml,"name",(char *)0x0);
  pcVar6 = (char *)(material->super_Instance).name._M_string_length;
  strlen(pcVar3);
  std::__cxx11::string::_M_replace((ulong)&(material->super_Instance).name,0,pcVar6,(ulong)pcVar3);
  (material->super_Instance).type = MATERIAL;
  local_2c0 = material;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"instance_effect","");
  pXVar4 = get_element(xml,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if (pXVar4 == (XMLElement *)0x0) {
    exit(1);
  }
  pXVar5 = get_technique_common(pXVar4);
  pXVar4 = get_technique_cmu462(pXVar4);
  if (pXVar4 != (XMLElement *)0x0) {
    pXVar4 = tinyxml2::XMLNode::FirstChildElement(&pXVar4->super_XMLNode,(char *)0x0);
    if (pXVar4 == (XMLElement *)0x0) {
      return;
    }
    local_278 = (_func_int **)&PTR_f_00277098;
    local_280 = &PTR__Sampler3D_00277170;
    local_288 = (_func_int **)&PTR_f_00276f90;
    local_2a0 = (_func_int **)&PTR_f_00276fe8;
    local_2a8 = (_func_int **)&PTR_f_00277040;
    do {
      pcVar6 = tinyxml2::XMLNode::Value(&pXVar4->super_XMLNode);
      std::__cxx11::string::string((string *)local_150,pcVar6,&local_2dd);
      iVar2 = std::__cxx11::string::compare((char *)local_150);
      if (iVar2 == 0) {
        local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_170,"radiance","");
        pXVar5 = get_element(pXVar4,&local_170);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_170._M_dataplus._M_p != &local_170.field_2) {
          operator_delete(local_170._M_dataplus._M_p);
        }
        pcVar6 = tinyxml2::XMLElement::GetText(pXVar5);
        std::__cxx11::string::string((string *)&local_b0,pcVar6,&local_2dd);
        SVar10 = spectrum_from_string(&local_b0);
        local_2dc = SVar10.b;
        local_2d8._8_4_ = extraout_XMM0_Dc_01;
        local_2d8._0_8_ = SVar10._0_8_;
        local_2d8._12_4_ = extraout_XMM0_Dd_01;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
          operator_delete(local_b0._M_dataplus._M_p);
        }
        pBVar9 = (BSDF *)operator_new(0x28);
        (pBVar9->rasterize_color).r = 0.0;
        (pBVar9->rasterize_color).g = 0.0;
        (pBVar9->rasterize_color).b = 0.0;
        pBVar9->_vptr_BSDF = local_278;
        *(undefined8 *)&pBVar9->field_0x14 = local_2d8._0_8_;
        *(float *)((long)&pBVar9[1]._vptr_BSDF + 4) = local_2dc;
        *(undefined ***)&pBVar9[1].rasterize_color = local_280;
LAB_0016a8b4:
        local_2c0->bsdf = pBVar9;
      }
      else {
        iVar2 = std::__cxx11::string::compare((char *)local_150);
        if (iVar2 == 0) {
          local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_190,"reflectance","");
          pXVar5 = get_element(pXVar4,&local_190);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_190._M_dataplus._M_p != &local_190.field_2) {
            operator_delete(local_190._M_dataplus._M_p);
          }
          pcVar6 = tinyxml2::XMLElement::GetText(pXVar5);
          std::__cxx11::string::string((string *)&local_d0,pcVar6,&local_2dd);
          SVar10 = spectrum_from_string(&local_d0);
          local_2dc = SVar10.b;
          local_2d8._8_4_ = extraout_XMM0_Dc_02;
          local_2d8._0_8_ = SVar10._0_8_;
          local_2d8._12_4_ = extraout_XMM0_Dd_02;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
            operator_delete(local_d0._M_dataplus._M_p);
          }
          pBVar9 = (BSDF *)operator_new(0x28);
          pBVar9->_vptr_BSDF = local_288;
          *(undefined4 *)&pBVar9[1]._vptr_BSDF = local_2d8._0_4_;
          *(undefined4 *)((long)&pBVar9[1]._vptr_BSDF + 4) = local_2d8._4_4_;
          pBVar9[1].rasterize_color.r = local_2dc;
LAB_0016a8ab:
          (pBVar9->rasterize_color).r = (float)local_2d8._0_4_;
          (pBVar9->rasterize_color).g = (float)local_2d8._4_4_;
          (pBVar9->rasterize_color).b = local_2dc;
          goto LAB_0016a8b4;
        }
        iVar2 = std::__cxx11::string::compare((char *)local_150);
        if (iVar2 == 0) {
          local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b0,"transmittance","");
          pXVar5 = get_element(pXVar4,&local_1b0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
            operator_delete(local_1b0._M_dataplus._M_p);
          }
          local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d0,"roughness","");
          pXVar7 = get_element(pXVar4,&local_1d0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
            operator_delete(local_1d0._M_dataplus._M_p);
          }
          local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f0,"ior","");
          pXVar8 = get_element(pXVar4,&local_1f0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
            operator_delete(local_1f0._M_dataplus._M_p);
          }
          pcVar6 = tinyxml2::XMLElement::GetText(pXVar5);
          std::__cxx11::string::string((string *)&local_f0,pcVar6,&local_2dd);
          SVar10 = spectrum_from_string(&local_f0);
          local_2dc = SVar10.b;
          local_2d8._8_4_ = extraout_XMM0_Dc_03;
          local_2d8._0_8_ = SVar10._0_8_;
          local_2d8._12_4_ = extraout_XMM0_Dd_03;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
            operator_delete(local_f0._M_dataplus._M_p);
          }
          pcVar6 = tinyxml2::XMLElement::GetText(pXVar7);
          dVar1 = atof(pcVar6);
          local_2b8._0_8_ = dVar1;
          pcVar6 = tinyxml2::XMLElement::GetText(pXVar8);
          local_2c8 = atof(pcVar6);
          pBVar9 = (BSDF *)operator_new(0x28);
          pBVar9->_vptr_BSDF = local_2a0;
          *(float *)&pBVar9->field_0x14 = (float)local_2c8;
          *(float *)&pBVar9[1]._vptr_BSDF = (float)(double)local_2b8._0_8_;
          *(undefined4 *)((long)&pBVar9[1]._vptr_BSDF + 4) = local_2d8._0_4_;
          pBVar9[1].rasterize_color.r = (float)local_2d8._4_4_;
          pBVar9[1].rasterize_color.g = local_2dc;
          goto LAB_0016a8ab;
        }
        iVar2 = std::__cxx11::string::compare((char *)local_150);
        if (iVar2 == 0) {
          local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_210,"transmittance","");
          pXVar5 = get_element(pXVar4,&local_210);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_210._M_dataplus._M_p != &local_210.field_2) {
            operator_delete(local_210._M_dataplus._M_p);
          }
          local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_230,"reflectance","");
          pXVar7 = get_element(pXVar4,&local_230);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_230._M_dataplus._M_p != &local_230.field_2) {
            operator_delete(local_230._M_dataplus._M_p);
          }
          local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_250,"roughness","");
          pXVar8 = get_element(pXVar4,&local_250);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_250._M_dataplus._M_p != &local_250.field_2) {
            operator_delete(local_250._M_dataplus._M_p);
          }
          local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_270,"ior","");
          this = get_element(pXVar4,&local_270);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_270._M_dataplus._M_p != &local_270.field_2) {
            operator_delete(local_270._M_dataplus._M_p);
          }
          pcVar6 = tinyxml2::XMLElement::GetText(pXVar5);
          std::__cxx11::string::string((string *)&local_110,pcVar6,&local_2dd);
          SVar10 = spectrum_from_string(&local_110);
          local_2dc = SVar10.b;
          local_2d8._8_4_ = extraout_XMM0_Dc;
          local_2d8._0_8_ = SVar10._0_8_;
          local_2d8._12_4_ = extraout_XMM0_Dd;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_110._M_dataplus._M_p != &local_110.field_2) {
            operator_delete(local_110._M_dataplus._M_p);
          }
          pcVar6 = tinyxml2::XMLElement::GetText(pXVar7);
          std::__cxx11::string::string((string *)&local_130,pcVar6,&local_2dd);
          SVar10 = spectrum_from_string(&local_130);
          local_2b8._8_4_ = extraout_XMM0_Dc_00;
          local_2b8._0_8_ = SVar10._0_8_;
          local_2b8._12_4_ = extraout_XMM0_Dd_00;
          local_2c8 = (double)CONCAT44(local_2c8._4_4_,SVar10.b);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_130._M_dataplus._M_p != &local_130.field_2) {
            operator_delete(local_130._M_dataplus._M_p);
          }
          pcVar6 = tinyxml2::XMLElement::GetText(pXVar8);
          local_290 = atof(pcVar6);
          pcVar6 = tinyxml2::XMLElement::GetText(this);
          local_298 = atof(pcVar6);
          pBVar9 = (BSDF *)operator_new(0x38);
          pBVar9->_vptr_BSDF = local_2a8;
          *(float *)&pBVar9->field_0x14 = (float)local_298;
          *(float *)&pBVar9[1]._vptr_BSDF = (float)local_290;
          *(undefined8 *)((long)&pBVar9[1]._vptr_BSDF + 4) = local_2b8._0_8_;
          pBVar9[1].rasterize_color.g = local_2c8._0_4_;
          pBVar9[1].rasterize_color.b = (float)local_2d8._0_4_;
          *(undefined4 *)&pBVar9[1].field_0x14 = local_2d8._4_4_;
          *(float *)&pBVar9[2]._vptr_BSDF = local_2dc;
          goto LAB_0016a8ab;
        }
      }
      pXVar4 = tinyxml2::XMLNode::NextSiblingElement(&pXVar4->super_XMLNode,(char *)0x0);
      if (local_150[0] != local_140) {
        operator_delete(local_150[0]);
      }
      if (pXVar4 == (XMLElement *)0x0) {
        return;
      }
    } while( true );
  }
  if (pXVar5 != (XMLElement *)0x0) {
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"phong/diffuse/color","");
    pXVar4 = get_element(pXVar5,&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
    if (pXVar4 != (XMLElement *)0x0) {
      pcVar6 = tinyxml2::XMLElement::GetText(pXVar4);
      std::__cxx11::string::string((string *)&local_90,pcVar6,(allocator *)local_150);
      SVar10 = spectrum_from_string(&local_90);
      local_2dc = SVar10.b;
      local_2d8._8_4_ = extraout_XMM0_Dc_04;
      local_2d8._0_8_ = SVar10._0_8_;
      local_2d8._12_4_ = extraout_XMM0_Dd_04;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p);
      }
      pBVar9 = (BSDF *)operator_new(0x28);
      pBVar9->_vptr_BSDF = (_func_int **)&PTR_f_00276f38;
      *(undefined8 *)&pBVar9->field_0x14 = local_2d8._0_8_;
      *(float *)((long)&pBVar9[1]._vptr_BSDF + 4) = local_2dc;
      *(undefined ***)&pBVar9[1].rasterize_color = &PTR__Sampler3D_00277170;
      (pBVar9->rasterize_color).r = (float)local_2d8._0_4_;
      (pBVar9->rasterize_color).g = (float)local_2d8._4_4_;
      (pBVar9->rasterize_color).b = local_2dc;
      goto LAB_0016aa21;
    }
  }
  pBVar9 = (BSDF *)operator_new(0x28);
  pBVar9->_vptr_BSDF = (_func_int **)&PTR_f_00276f38;
  pBVar9[1]._vptr_BSDF = (_func_int **)0x3f0000003f000000;
  *(undefined ***)&pBVar9[1].rasterize_color = &PTR__Sampler3D_00277170;
  (pBVar9->rasterize_color).r = 0.5;
  (pBVar9->rasterize_color).g = 0.5;
  *(undefined8 *)&(pBVar9->rasterize_color).b = 0x3f0000003f000000;
LAB_0016aa21:
  local_2c0->bsdf = pBVar9;
  return;
}

Assistant:

void ColladaParser::parse_material(XMLElement* xml, MaterialInfo& material) {
  // name & id
  material.id = xml->Attribute("id");
  material.name = xml->Attribute("name");
  material.type = Instance::MATERIAL;

  // parse effect
  XMLElement* e_effect = get_element(xml, "instance_effect");
  if (e_effect) {
    // if the material does not have additional specification in the 462
    // profile. The diffuse color will be used to create a diffuse BSDF,
    // Other information from the common profile are ignored

    XMLElement* tech_common = get_technique_common(e_effect);  // common profile
    XMLElement* tech_cmu462 = get_technique_cmu462(e_effect);  // cmu462 profile

    if (tech_cmu462) {
      XMLElement* e_bsdf = tech_cmu462->FirstChildElement();
      while (e_bsdf) {
        string type = e_bsdf->Name();
        if (type == "emission") {
          XMLElement* e_radiance = get_element(e_bsdf, "radiance");
          Spectrum radiance =
              spectrum_from_string(string(e_radiance->GetText()));
          BSDF* bsdf = new EmissionBSDF(radiance);
          material.bsdf = bsdf;
        } else if (type == "mirror") {
          XMLElement* e_reflectance = get_element(e_bsdf, "reflectance");
          Spectrum reflectance =
              spectrum_from_string(string(e_reflectance->GetText()));
          BSDF* bsdf = new MirrorBSDF(reflectance);
          material.bsdf = bsdf;
          /*
          if (type == "glossy") {
            XMLElement *e_reflectance  = get_element(e_bsdf, "reflectance");
            XMLElement *e_roughness = get_element(e_bsdf, "roughness");
            Spectrum reflectance =
          spectrum_from_string(string(e_reflectance->GetText()));
            float roughness = atof(e_roughness->GetText());
            BSDF* bsdf = new GlossyBSDF(reflectance, roughness);
            material.bsdf = bsdf;
          */
        } else if (type == "refraction") {
          XMLElement* e_transmittance = get_element(e_bsdf, "transmittance");
          XMLElement* e_roughness = get_element(e_bsdf, "roughness");
          XMLElement* e_ior = get_element(e_bsdf, "ior");
          Spectrum transmittance =
              spectrum_from_string(string(e_transmittance->GetText()));
          float roughness = atof(e_roughness->GetText());
          float ior = atof(e_ior->GetText());
          BSDF* bsdf = new RefractionBSDF(transmittance, roughness, ior);
          material.bsdf = bsdf;
        } else if (type == "glass") {
          XMLElement* e_transmittance = get_element(e_bsdf, "transmittance");
          XMLElement* e_reflectance = get_element(e_bsdf, "reflectance");
          XMLElement* e_roughness = get_element(e_bsdf, "roughness");
          XMLElement* e_ior = get_element(e_bsdf, "ior");
          Spectrum transmittance =
              spectrum_from_string(string(e_transmittance->GetText()));
          Spectrum reflectance =
              spectrum_from_string(string(e_reflectance->GetText()));
          float roughness = atof(e_roughness->GetText());
          float ior = atof(e_ior->GetText());
          BSDF* bsdf =
              new GlassBSDF(transmittance, reflectance, roughness, ior);
          material.bsdf = bsdf;
        }

        e_bsdf = e_bsdf->NextSiblingElement();
      }
    } else if (tech_common) {
      XMLElement* e_diffuse = get_element(tech_common, "phong/diffuse/color");
      if (e_diffuse) {
        Spectrum albedo = spectrum_from_string(string(e_diffuse->GetText()));
        material.bsdf = new DiffuseBSDF(albedo);
      } else {
        material.bsdf = new DiffuseBSDF(Spectrum(.5f, .5f, .5f));
      }
    } else {
      BSDF* bsdf = new DiffuseBSDF(Spectrum(.5f, .5f, .5f));
      material.bsdf = bsdf;
    }
  } else {
    stat("Error: no target effects found for material: " << material.id);
    exit(EXIT_FAILURE);
  }

  // print summary
  stat("  |- " << material);
}